

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateIndexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint8_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ValueLength VVar4;
  Exception *this_00;
  byte bVar5;
  long lVar6;
  uint8_t *puVar7;
  char *msg;
  uint8_t *start;
  uint8_t *puVar8;
  long lVar9;
  uint8_t *puVar10;
  ValueLength length_00;
  unsigned_long local_48;
  uint8_t *local_38;
  
  uVar1 = *ptr;
  bVar5 = uVar1 - 6;
  length_00 = 1L << (bVar5 & 0x3f);
  validateBufferLength(this,(2L << (bVar5 & 0x3f)) + 2,length,true);
  puVar8 = ptr + 1;
  uVar2 = readIntegerNonEmpty<unsigned_long>(puVar8,length_00);
  if (length < uVar2) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
    goto LAB_00109ea6;
  }
  if (uVar1 == '\t') {
    local_48 = readIntegerNonEmpty<unsigned_long>(ptr + (uVar2 - length_00),length_00);
    if (local_48 == 0) {
LAB_00109edb:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array nrItems value is invalid";
      goto LAB_00109ea6;
    }
    puVar10 = ptr + (uVar2 - length_00) + -(local_48 << (bVar5 & 0x3f));
    if ((puVar10 < ptr + length_00) || (ptr + length_00 * -2 + length < puVar10)) {
LAB_00109eef:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array index table is out of bounds";
      goto LAB_00109ea6;
    }
    puVar8 = puVar8 + length_00;
  }
  else {
    start = puVar8 + length_00;
    local_48 = readIntegerNonEmpty<unsigned_long>(start,length_00);
    if (local_48 == 0) goto LAB_00109edb;
    lVar9 = -2L << (bVar5 & 0x3f);
    puVar10 = ptr + uVar2;
    puVar7 = start + lVar9 + length_00 + 8;
    if (puVar10 < start + lVar9 + length_00 + 8) {
      puVar7 = puVar10;
    }
    for (lVar6 = 0; (puVar8 = start + lVar6 + length_00, puVar8 < puVar7 && (*puVar8 == '\0'));
        lVar6 = lVar6 + 1) {
    }
    if ((lVar6 != 0) && (lVar9 + 8 != lVar6)) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array padding is invalid";
      goto LAB_00109ea6;
    }
    puVar10 = puVar10 + -(local_48 << (bVar5 & 0x3f));
    if (((puVar10 < ptr + length_00 * 2) || (puVar10 < puVar8)) ||
       (ptr + (length - length_00) < puVar10)) goto LAB_00109eef;
  }
  uVar2 = 0;
  for (; puVar8 < puVar10; puVar8 = puVar8 + VVar4) {
    validatePart(this,puVar8,(long)puVar10 - (long)puVar8,true);
    uVar3 = readIntegerNonEmpty<unsigned_long>(puVar10 + (uVar2 << (bVar5 & 0x3f)),length_00);
    if (uVar3 != (long)puVar8 - (long)ptr) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array index table is wrong";
      goto LAB_00109ea6;
    }
    local_38 = puVar8;
    VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_38);
    uVar2 = uVar2 + 1;
  }
  if (local_48 == uVar2) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Array has more items than in index";
LAB_00109ea6:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedArray(uint8_t const* ptr, std::size_t length) {
  // Array with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x06U);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x09U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = ptr + 1 + byteSizeLength;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);
    ValueLength offset = readIntegerNonEmpty<ValueLength>(
        indexTable + actualNrItems * byteSizeLength, byteSizeLength);
    if (offset != static_cast<ValueLength>(member - ptr)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is wrong");
    }

    member += Slice(member).byteSize();
    ++actualNrItems;
  }

  if (actualNrItems != nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array has more items than in index");
  }
}